

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_kfold_fpmath(jit_State *J)

{
  TRef TVar1;
  double u64;
  
  u64 = lj_vm_foldfpm((double)(J->fold).left[1],(uint)(J->fold).ins.field_0.op2);
  TVar1 = lj_ir_knum_u64(J,(uint64_t)u64);
  return TVar1;
}

Assistant:

LJFOLD(FPMATH KNUM any)
LJFOLDF(kfold_fpmath)
{
  lua_Number a = knumleft;
  lua_Number y = lj_vm_foldfpm(a, fins->op2);
  return lj_ir_knum(J, y);
}